

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void __thiscall
duckdb::HistogramBinState<long>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<long> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  pointer __src;
  size_type __n;
  vector<long,_std::allocator<long>_> *this_00;
  iterator __position;
  long lVar1;
  unsafe_vector<long> *puVar2;
  unsafe_vector<idx_t> *puVar3;
  Vector *this_01;
  idx_t count_00;
  ulong uVar4;
  pointer plVar5;
  BinderException *pBVar6;
  pointer plVar7;
  size_type sVar8;
  ulong uVar9;
  pointer *pplVar10;
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  string local_e0;
  undefined1 local_c0 [16];
  SelectionVector local_b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  UnifiedVectorFormat local_78;
  
  puVar2 = (unsafe_vector<long> *)operator_new(0x18);
  (puVar2->super_vector<long,_std::allocator<long>_>).
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (puVar2->super_vector<long,_std::allocator<long>_>).
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (puVar2->super_vector<long,_std::allocator<long>_>).
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  this->bin_boundaries = puVar2;
  puVar3 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar3->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar3;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(bin_vector,count,&local_78);
  if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
    pos = (idx_t)(local_78.sel)->sel_vector[pos];
  }
  uVar9 = *(ulong *)(local_78.data + pos * 0x10);
  __n = *(size_type *)(local_78.data + pos * 0x10 + 8);
  if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[pos >> 6] >>
       (pos & 0x3f) & 1) == 0)) {
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    local_c0._0_8_ = local_b0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"Histogram bin list cannot be NULL","");
    BinderException::BinderException(pBVar6,(string *)local_c0);
    __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = ListVector::GetEntry(bin_vector);
  count_00 = ListVector::GetListSize(bin_vector);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  Vector::ToUnifiedFormat(this_01,count_00,(UnifiedVectorFormat *)local_c0);
  ::std::vector<long,_std::allocator<long>_>::reserve
            (&this->bin_boundaries->super_vector<long,_std::allocator<long>_>,__n);
  if (__n != 0) {
    sVar8 = __n;
    do {
      uVar4 = uVar9;
      if (*(long *)local_c0._0_8_ != 0) {
        uVar4 = (ulong)*(uint *)(*(long *)local_c0._0_8_ + uVar9 * 4);
      }
      if ((unsigned_long *)local_b0[0].sel_vector != (unsigned_long *)0x0) {
        if ((*(ulong *)((long)local_b0[0].sel_vector + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) == 0
           ) {
          pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"Histogram bin entry cannot be NULL","");
          BinderException::BinderException(pBVar6,&local_e0);
          __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar4 = uVar9;
      if (*(long *)local_c0._0_8_ != 0) {
        uVar4 = (ulong)*(uint *)(*(long *)local_c0._0_8_ + uVar9 * 4);
      }
      this_00 = &this->bin_boundaries->super_vector<long,_std::allocator<long>_>;
      local_e0._M_dataplus._M_p = *(pointer *)(local_c0._8_8_ + uVar4 * 8);
      __position._M_current =
           (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        ::std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (this_00,__position,(long *)&local_e0);
      }
      else {
        *__position._M_current = (long)local_e0._M_dataplus._M_p;
        (this_00->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      uVar9 = uVar9 + 1;
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
  }
  plVar5 = (this->bin_boundaries->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar7 = (this->bin_boundaries->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (plVar5 != plVar7) {
    uVar9 = (long)plVar7 - (long)plVar5 >> 3;
    lVar1 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar5,plVar7,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar5,plVar7);
  }
  puVar2 = this->bin_boundaries;
  plVar5 = (puVar2->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  plVar7 = (puVar2->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (8 < (ulong)((long)plVar7 - (long)plVar5)) {
    uVar9 = 1;
    do {
      pplVar10 = &(puVar2->super_vector<long,_std::allocator<long>_>).
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish;
      if (plVar5[uVar9 + 0xffffffffffffffff] == plVar5[uVar9]) {
        __src = plVar5 + uVar9 + 1;
        if (__src != plVar7) {
          memmove(plVar5 + uVar9,__src,(long)plVar7 - (long)__src);
        }
        uVar9 = uVar9 - 1;
        *pplVar10 = *pplVar10 + -1;
      }
      uVar9 = uVar9 + 1;
      puVar2 = this->bin_boundaries;
      plVar5 = (puVar2->super_vector<long,_std::allocator<long>_>).
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start;
      plVar7 = (puVar2->super_vector<long,_std::allocator<long>_>).
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish;
    } while (uVar9 < (ulong)((long)plVar7 - (long)plVar5 >> 3));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts,__n + 1);
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (local_b0[0].selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0[0].selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}